

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O0

str __thiscall pybind11::repr(pybind11 *this,handle h)

{
  PyObject **ppPVar1;
  error_already_set *this_00;
  handle local_38 [3];
  PyObject *local_20;
  PyObject *str_value;
  handle h_local;
  
  str_value = h.m_ptr;
  h_local.m_ptr = (PyObject *)this;
  ppPVar1 = handle::ptr((handle *)&str_value);
  local_20 = (PyObject *)PyObject_Repr(*ppPVar1);
  if (local_20 == (PyObject *)0x0) {
    this_00 = (error_already_set *)__cxa_allocate_exception(0x28);
    error_already_set::error_already_set(this_00);
    __cxa_throw(this_00,&error_already_set::typeinfo,error_already_set::~error_already_set);
  }
  handle::handle(local_38,local_20);
  reinterpret_steal<pybind11::str>(this,local_38[0]);
  return (object)(object)this;
}

Assistant:

inline str repr(handle h) {
    PyObject *str_value = PyObject_Repr(h.ptr());
    if (!str_value) throw error_already_set();
#if PY_MAJOR_VERSION < 3
    PyObject *unicode = PyUnicode_FromEncodedObject(str_value, "utf-8", nullptr);
    Py_XDECREF(str_value); str_value = unicode;
    if (!str_value) throw error_already_set();
#endif
    return reinterpret_steal<str>(str_value);
}